

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTuneChakraProfile.cpp
# Opt level: O3

void VTuneChakraProfile::LogMethodNativeLoadEvent
               (FunctionBody *body,FunctionEntryPointInfo *entryPoint)

{
  char16 cVar1;
  char16_t cVar2;
  code *pcVar3;
  ExecutionMode EVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  char16 *pcVar8;
  ulong uVar9;
  size_t sVar10;
  undefined4 *puVar11;
  HeapAllocator *pHVar12;
  utf8char_t *dest;
  _LineNumberInfo *obj;
  utf8char_t *buffer;
  char16_t *pcVar13;
  size_t sVar14;
  char16_t *string;
  uint cchSource;
  char16_t local_2f8 [4];
  char16 numberBuffer [20];
  char16_t local_2c8;
  char16 local_2c6 [3];
  char16 methodNameBuffer [260];
  TrackAllocData data;
  size_t local_50;
  size_t urlLength;
  FunctionBody *local_40;
  ULONG local_34;
  
  if (!isJitProfilingActive) {
    return;
  }
  data.line = 0;
  data._36_4_ = 0;
  pcVar8 = Js::ParseableFunctionInfo::GetExternalDisplayName(&body->super_ParseableFunctionInfo);
  local_34 = Js::ParseableFunctionInfo::GetLineNumber(&body->super_ParseableFunctionInfo);
  string = local_2f8;
  _ltow((ulong)local_34,string,10);
  if (pcVar8 != (char16 *)0x0) {
    uVar9 = 1;
    sVar14 = 0x206;
    do {
      cVar1 = pcVar8[uVar9 - 1];
      numberBuffer[uVar9 + 0x13] = cVar1;
      if (cVar1 == L'\0') {
        if (uVar9 < 0x104) {
          memset(local_2c6 + (uVar9 - 1),0xfd,sVar14);
        }
        goto LAB_007cde87;
      }
      uVar9 = uVar9 + 1;
      sVar14 = sVar14 - 2;
    } while (sVar14 != 0xfffffffffffffffe);
  }
  local_2c8 = L'\0';
  memset(local_2c6,0xfd,0x206);
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
LAB_007cde87:
  EVar4 = Js::FunctionEntryPointInfo::GetJitMode(entryPoint);
  if (EVar4 == SimpleJit) {
    uVar9 = 1;
    sVar14 = 0x206;
    do {
      if (numberBuffer[uVar9 + 0x13] == L'\0') {
        pcVar13 = L" Simple";
        goto LAB_007cdee1;
      }
      uVar9 = uVar9 + 1;
      sVar14 = sVar14 - 2;
    } while (sVar14 != 0xfffffffffffffffe);
    goto LAB_007cdf06;
  }
  goto LAB_007cdf32;
  while( true ) {
    pcVar13 = pcVar13 + 1;
    uVar9 = uVar9 + 1;
    sVar14 = sVar14 - 2;
    if (sVar14 == 0xfffffffffffffffe) break;
LAB_007cdf5d:
    cVar2 = *pcVar13;
    numberBuffer[uVar9 + 0x13] = cVar2;
    if (cVar2 == L'\0') {
      if (uVar9 < 0x104) {
        memset(local_2c6 + (uVar9 - 1),0xfd,sVar14);
      }
      goto LAB_007cdfae;
    }
  }
  goto LAB_007cdf82;
  while( true ) {
    string = string + 1;
    uVar9 = uVar9 + 1;
    sVar14 = sVar14 - 2;
    if (sVar14 == 0xfffffffffffffffe) break;
LAB_007ce031:
    cVar2 = *string;
    numberBuffer[uVar9 + 0x13] = cVar2;
    if (cVar2 == L'\0') {
      if (uVar9 < 0x104) {
        memset(local_2c6 + (uVar9 - 1),0xfd,sVar14);
      }
      goto LAB_007cdffc;
    }
  }
  goto LAB_007cdfd0;
  while( true ) {
    pcVar13 = pcVar13 + 1;
    uVar9 = uVar9 + 1;
    sVar14 = sVar14 - 2;
    if (sVar14 == 0xfffffffffffffffe) break;
LAB_007cdee1:
    cVar2 = *pcVar13;
    numberBuffer[uVar9 + 0x13] = cVar2;
    if (cVar2 == L'\0') {
      if (uVar9 < 0x104) {
        memset(local_2c6 + (uVar9 - 1),0xfd,sVar14);
      }
      goto LAB_007cdf32;
    }
  }
LAB_007cdf06:
  local_2c8 = L'\0';
  memset(local_2c6,0xfd,0x206);
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
LAB_007cdf32:
  uVar9 = 1;
  sVar14 = 0x206;
  do {
    if (numberBuffer[uVar9 + 0x13] == L'\0') {
      pcVar13 = L" {line:";
      goto LAB_007cdf5d;
    }
    uVar9 = uVar9 + 1;
    sVar14 = sVar14 - 2;
  } while (sVar14 != 0xfffffffffffffffe);
LAB_007cdf82:
  local_2c8 = L'\0';
  memset(local_2c6,0xfd,0x206);
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
LAB_007cdfae:
  uVar9 = 1;
  sVar14 = 0x206;
  do {
    if (numberBuffer[uVar9 + 0x13] == L'\0') goto LAB_007ce031;
    uVar9 = uVar9 + 1;
    sVar14 = sVar14 - 2;
  } while (sVar14 != 0xfffffffffffffffe);
LAB_007cdfd0:
  local_2c8 = L'\0';
  memset(local_2c6,0xfd,0x206);
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
LAB_007cdffc:
  uVar9 = 2;
  sVar14 = 0x204;
  do {
    if (numberBuffer[uVar9 + 0x12] == L'\0') {
      numberBuffer[uVar9 + 0x12] = L'}';
      if (sVar14 != 0xfffffffffffffffe) {
        numberBuffer[uVar9 + 0x13] = L'\0';
        if (uVar9 < 0x104) {
          memset(local_2c6 + (uVar9 - 1),0xfd,sVar14);
        }
        goto LAB_007ce0a2;
      }
      break;
    }
    uVar9 = uVar9 + 1;
    sVar14 = sVar14 - 2;
  } while (sVar14 != 0xfffffffffffffffc);
  local_2c8 = L'\0';
  memset(local_2c6,0xfd,0x206);
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
LAB_007ce0a2:
  sVar10 = PAL_wcslen(&local_2c8);
  if (0x103 < sVar10) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/VTuneChakraProfile.cpp"
                       ,0x42,"(methodLength < 260)","methodLength < _MAX_PATH");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar11 = 0;
  }
  cchSource = (uint)sVar10;
  local_40 = body;
  if (cchSource < 0x55555555) {
    uVar9 = (ulong)(cchSource * 3 + 1);
    methodNameBuffer._512_8_ = &unsigned_char::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_32b4643;
    data.filename._0_4_ = 0x45;
    data.plusSize = uVar9;
    pHVar12 = Memory::HeapAllocator::TrackAllocInfo
                        (&Memory::HeapAllocator::Instance,
                         (TrackAllocData *)(methodNameBuffer + 0x100));
    dest = (utf8char_t *)Memory::HeapAllocator::AllocT<true>(pHVar12,uVar9);
    if (dest != (utf8char_t *)0x0) {
      uVar6 = iJIT_GetNewMethodID();
      data.line = uVar6;
      urlLength = uVar9;
      utf8::EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)0>(dest,uVar9,&local_2c8,cchSource);
      Js::EntryPointInfo::GetNativeAddress(&entryPoint->super_EntryPointInfo);
      Js::EntryPointInfo::GetCodeSize(&entryPoint->super_EntryPointInfo);
      iVar7 = Js::EntryPointInfo::GetNativeOffsetMapCount(&entryPoint->super_EntryPointInfo);
      uVar9 = (ulong)(iVar7 * 2 + 1);
      methodNameBuffer._512_8_ = &_LineNumberInfo::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_32b4643;
      data.filename._0_4_ = 0x51;
      data.plusSize = uVar9;
      pHVar12 = Memory::HeapAllocator::TrackAllocInfo
                          (&Memory::HeapAllocator::Instance,
                           (TrackAllocData *)(methodNameBuffer + 0x100));
      obj = (_LineNumberInfo *)Memory::HeapAllocator::AllocT<true>(pHVar12,uVar9 * 8);
      if ((obj == (_LineNumberInfo *)0x0) || (DAT_015962f3 == '\x01')) {
        methodNameBuffer._512_8_ = (ulong)local_34 << 0x20;
      }
      else {
        Js::EntryPointInfo::PopulateLineInfo(&entryPoint->super_EntryPointInfo,obj,local_40);
      }
      local_50 = 0;
      buffer = GetUrl(local_40,&local_50);
      Output::Trace(ProfilerPhase,L"Method load event: %s\n",&local_2c8);
      iJIT_NotifyEvent(iJVM_EVENT_TYPE_METHOD_LOAD_FINISHED,&data.line);
      Memory::DeleteArray<Memory::HeapAllocator,_LineNumberInfo>
                (&Memory::HeapAllocator::Instance,uVar9,obj);
      if (local_50 != 0) {
        Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,buffer,local_50);
      }
      Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,dest,urlLength);
    }
    return;
  }
  Math::DefaultOverflowPolicy();
}

Assistant:

void VTuneChakraProfile::LogMethodNativeLoadEvent(Js::FunctionBody* body, Js::FunctionEntryPointInfo* entryPoint)
{
#if ENABLE_NATIVE_CODEGEN
    if (isJitProfilingActive)
    {
        iJIT_Method_Load methodInfo;
        memset(&methodInfo, 0, sizeof(iJIT_Method_Load));
        const char16* methodName = body->GetExternalDisplayName();
        // Append function line number info to method name so that VTune can distinguish between polymorphic methods
        char16 methodNameBuffer[_MAX_PATH];
        ULONG lineNumber = body->GetLineNumber();
        char16 numberBuffer[20];
        _ltow_s(lineNumber, numberBuffer, 10);
        wcscpy_s(methodNameBuffer, methodName);
        if (entryPoint->GetJitMode() == ExecutionMode::SimpleJit)
        {
            wcscat_s(methodNameBuffer, _u(" Simple"));
        }
        wcscat_s(methodNameBuffer, _u(" {line:"));
        wcscat_s(methodNameBuffer, numberBuffer);
        wcscat_s(methodNameBuffer, _u("}"));

        size_t methodLength = wcslen(methodNameBuffer);
        Assert(methodLength < _MAX_PATH);
        charcount_t ccMethodLength = static_cast<charcount_t>(methodLength);
        size_t cbUtf8MethodName = UInt32Math::MulAdd<3, 1>(ccMethodLength);
        utf8char_t* utf8MethodName = HeapNewNoThrowArray(utf8char_t, cbUtf8MethodName);
        if (utf8MethodName)
        {
            methodInfo.method_id = iJIT_GetNewMethodID();
            utf8::EncodeIntoAndNullTerminate<utf8::Utf8EncodingKind::Cesu8>(utf8MethodName, cbUtf8MethodName, methodNameBuffer, ccMethodLength);
            methodInfo.method_name = (char*)utf8MethodName;
            methodInfo.method_load_address = (void*)entryPoint->GetNativeAddress();
            methodInfo.method_size = (uint)entryPoint->GetCodeSize();        // Size in memory - Must be exact

            LineNumberInfo numberInfo[1];

            uint lineCount = (entryPoint->GetNativeOffsetMapCount()) * 2 + 1; // may need to record both .begin and .end for all elements
            LineNumberInfo* pLineInfo = HeapNewNoThrowArray(LineNumberInfo, lineCount);

            if (pLineInfo == NULL || Js::Configuration::Global.flags.DisableVTuneSourceLineInfo)
            {
                // resort to original implementation, attribute all samples to first line
                numberInfo[0].LineNumber = lineNumber;
                numberInfo[0].Offset = 0;
                methodInfo.line_number_size = 1;
                methodInfo.line_number_table = numberInfo;
            }
            else
            {
                int size = entryPoint->PopulateLineInfo(pLineInfo, body);
                methodInfo.line_number_size = size;
                methodInfo.line_number_table = pLineInfo;
            }

            size_t urlLength = 0;
            utf8char_t* utf8Url = GetUrl(body, &urlLength);
            methodInfo.source_file_name = (char*)utf8Url;
            OUTPUT_TRACE(Js::ProfilerPhase, _u("Method load event: %s\n"), methodNameBuffer);
            iJIT_NotifyEvent(iJVM_EVENT_TYPE_METHOD_LOAD_FINISHED, &methodInfo);

            HeapDeleteArray(lineCount, pLineInfo);

            if (urlLength > 0)
            {
                HeapDeleteArray(urlLength, utf8Url);
            }

            HeapDeleteArray(cbUtf8MethodName, utf8MethodName);
        }
    }
#endif
}